

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++:257:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:257:3)>
            *this)

{
  String *pSVar1;
  
  if ((this->canceled == false) && (pSVar1 = (this->func).oldPreload, 1 < (pSVar1->content).size_))
  {
    setenv("LD_PRELOAD",(pSVar1->content).ptr,1);
    return;
  }
  return;
}

Assistant:

inline ~Deferred() noexcept(false) { if (!canceled) func(); }